

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O3

void anon_unknown.dwarf_4ac6::Test_TemplateDictionary_SetValueAndTemplateStringAndArena::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  TemplateString TVar9;
  TemplateString TVar10;
  TemplateString TVar11;
  TemplateString TVar12;
  char *pcVar13;
  bool bVar14;
  int iVar15;
  long *plVar16;
  undefined8 extraout_RAX;
  long *plVar17;
  TemplateDictionary *pTVar18;
  string dump;
  TemplateDictionaryPeer peer;
  char expected [256];
  UnsafeArena *arenas [3];
  TemplateDictionary dict;
  UnsafeArena arena;
  TemplateString local_3f0;
  TemplateDictionaryPeer local_3d0;
  ulong uStack_3c8;
  TemplateDictionary local_3c0 [16];
  long local_3b0;
  TemplateString local_3a8 [8];
  char *local_2a8;
  undefined8 uStack_2a0;
  undefined1 local_298;
  undefined7 uStack_297;
  undefined8 uStack_290;
  char *local_288;
  undefined8 uStack_280;
  undefined1 local_278;
  undefined7 uStack_277;
  undefined8 uStack_270;
  char *local_268;
  undefined8 uStack_260;
  undefined1 local_258;
  undefined7 uStack_257;
  undefined8 uStack_250;
  BaseArena *local_248 [4];
  bool *local_228;
  size_t sStack_220;
  undefined1 local_218;
  uint7 uStack_217;
  undefined8 uStack_210;
  TemplateDictionary local_208 [112];
  undefined **local_198 [45];
  
  ctemplate::BaseArena::BaseArena((BaseArena *)local_198,(char *)0x0,100,false);
  local_198[0] = &PTR__BaseArena_0011dc00;
  local_248[2] = (BaseArena *)0x0;
  local_3b0 = 0;
  local_248[0] = (BaseArena *)local_198;
  local_248[1] = (BaseArena *)local_198;
  while( true ) {
    local_3d0.dict_ = local_3c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"test_arena","");
    plVar16 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_3d0,uStack_3c8,0,'\x01');
    local_3f0.ptr_ = &local_3f0.is_immutable_;
    plVar17 = plVar16 + 2;
    if ((bool *)*plVar16 == (bool *)plVar17) {
      local_3f0._16_8_ = *plVar17;
      local_3f0.id_ = plVar16[3];
    }
    else {
      local_3f0._16_8_ = *plVar17;
      local_3f0.ptr_ = (bool *)*plVar16;
    }
    local_3f0.length_ = plVar16[1];
    *plVar16 = (long)plVar17;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    local_3a8[0].ptr_ = local_3f0.ptr_;
    local_3a8[0].is_immutable_ = false;
    local_3a8[0].id_ = 0;
    local_3a8[0].length_ = local_3f0.length_;
    ctemplate::TemplateDictionary::TemplateDictionary
              (local_208,local_3a8,(UnsafeArena *)local_248[local_3b0]);
    if ((bool *)local_3f0.ptr_ != &local_3f0.is_immutable_) {
      operator_delete(local_3f0.ptr_);
    }
    if (local_3d0.dict_ != local_3c0) {
      operator_delete(local_3d0.dict_);
    }
    local_268 = "FOO";
    uStack_260 = 3;
    local_258 = 1;
    uStack_250 = 0;
    local_288 = "foo";
    uStack_280 = 3;
    local_278 = 1;
    uStack_270 = 0;
    TVar8._17_7_ = uStack_277;
    TVar8.is_immutable_ = true;
    TVar1._17_7_ = uStack_257;
    TVar1.is_immutable_ = true;
    TVar1.length_ = 3;
    TVar1.ptr_ = "FOO";
    TVar1.id_ = 0;
    TVar8.length_ = 3;
    TVar8.ptr_ = "foo";
    TVar8.id_ = 0;
    ctemplate::TemplateDictionary::SetValue(TVar1,TVar8);
    local_3a8[0].ptr_ = &local_3a8[0].is_immutable_;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"FOO2","");
    local_228 = (bool *)local_3a8[0].ptr_;
    sStack_220 = local_3a8[0].length_;
    local_218 = 0;
    uStack_210 = 0;
    local_2a8 = "foo2andmore";
    uStack_2a0 = 4;
    local_298 = 1;
    uStack_290 = 0;
    TVar9._17_7_ = uStack_297;
    TVar9.is_immutable_ = true;
    TVar2.length_ = local_3a8[0].length_;
    TVar2.ptr_ = local_3a8[0].ptr_;
    TVar2._16_8_ = (ulong)uStack_217 << 8;
    TVar2.id_ = 0;
    TVar9.length_ = 4;
    TVar9.ptr_ = "foo2andmore";
    TVar9.id_ = 0;
    ctemplate::TemplateDictionary::SetValue(TVar2,TVar9);
    if ((bool *)local_3a8[0].ptr_ != &local_3a8[0].is_immutable_) {
      operator_delete(local_3a8[0].ptr_);
    }
    local_3a8[0].ptr_ = "FOO3";
    local_3a8[0].length_ = 4;
    local_3a8[0].is_immutable_ = true;
    local_3a8[0].id_ = 0;
    local_3f0.ptr_ = "foo3";
    local_3f0.length_ = 4;
    local_3f0.is_immutable_ = true;
    local_3f0.id_ = 0;
    TVar3._17_7_ = local_3a8[0]._17_7_;
    TVar3.is_immutable_ = true;
    TVar3.length_ = 4;
    TVar3.ptr_ = "FOO3";
    TVar3.id_ = 0;
    TVar10.length_ = 4;
    TVar10.ptr_ = "foo3";
    TVar10.is_immutable_ = true;
    TVar10._17_7_ = local_3f0._17_7_;
    TVar10.id_ = 0;
    ctemplate::TemplateDictionary::SetValue(TVar3,TVar10);
    local_3d0.dict_ = local_3c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"FOO4","");
    local_3a8[0].ptr_ = (char *)local_3d0.dict_;
    local_3a8[0].length_ = uStack_3c8;
    local_3a8[0].is_immutable_ = false;
    local_3a8[0].id_ = 0;
    local_3f0.ptr_ = "foo4andmore";
    local_3f0.length_ = 4;
    local_3f0.is_immutable_ = true;
    local_3f0.id_ = 0;
    TVar4.length_ = uStack_3c8;
    TVar4.ptr_ = (char *)local_3d0.dict_;
    TVar4._16_8_ = (ulong)(uint7)local_3a8[0]._17_7_ << 8;
    TVar4.id_ = 0;
    TVar11.length_ = 4;
    TVar11.ptr_ = "foo4andmore";
    TVar11.is_immutable_ = true;
    TVar11._17_7_ = local_3f0._17_7_;
    TVar11.id_ = 0;
    ctemplate::TemplateDictionary::SetValue(TVar4,TVar11);
    if (local_3d0.dict_ != local_3c0) {
      operator_delete(local_3d0.dict_);
    }
    local_3d0.dict_ = local_3c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"Olaf","");
    pTVar18 = local_3d0.dict_ + uStack_3c8;
    local_3f0.ptr_ = (char *)local_3d0.dict_;
    if (uStack_3c8 == 0) {
      local_3f0.ptr_ = (char *)0x0;
    }
    local_3a8[0].ptr_ = "FOO5";
    local_3a8[0].length_ = 4;
    local_3a8[0].is_immutable_ = true;
    local_3a8[0].id_ = 0;
    if (uStack_3c8 == 0) {
      pTVar18 = (TemplateDictionary *)0x0;
    }
    local_3f0.length_ = (long)pTVar18 - (long)local_3f0.ptr_;
    bVar14 = local_3f0.ptr_ < (TemplateDictionary *)&data_start &&
             (TemplateDictionary *)&UNK_00109bbf < local_3f0.ptr_;
    local_3f0.is_immutable_ = bVar14;
    local_3f0.id_ = 0;
    TVar5._17_7_ = local_3a8[0]._17_7_;
    TVar5.is_immutable_ = true;
    TVar5.length_ = 4;
    TVar5.ptr_ = "FOO5";
    TVar5.id_ = 0;
    TVar12.length_ = local_3f0.length_;
    TVar12.ptr_ = local_3f0.ptr_;
    TVar12.is_immutable_ = bVar14;
    TVar12._17_7_ = local_3f0._17_7_;
    TVar12.id_ = 0;
    ctemplate::TemplateDictionary::SetValue(TVar5,TVar12);
    if (local_3d0.dict_ != local_3c0) {
      operator_delete(local_3d0.dict_);
    }
    local_3a8[0].ptr_ = "FOO6";
    local_3a8[0].length_ = 4;
    local_3a8[0].is_immutable_ = true;
    local_3a8[0].id_ = 0;
    TVar6._17_7_ = local_3a8[0]._17_7_;
    TVar6.is_immutable_ = true;
    TVar6.length_ = 4;
    TVar6.ptr_ = "FOO6";
    TVar6.id_ = 0;
    ctemplate::TemplateDictionary::SetIntValue(TVar6,(long)local_208);
    local_3a8[0].ptr_ = "FOO7";
    local_3a8[0].length_ = 4;
    local_3a8[0].is_immutable_ = true;
    local_3a8[0].id_ = 0;
    TVar7._17_7_ = local_3a8[0]._17_7_;
    TVar7.is_immutable_ = true;
    TVar7.length_ = 4;
    TVar7.ptr_ = "FOO7";
    TVar7.id_ = 0;
    ctemplate::TemplateDictionary::SetIntValue(TVar7,(long)local_208);
    local_3a8[0].ptr_ = "FOO";
    local_3a8[0].length_ = 3;
    local_3a8[0].is_immutable_ = true;
    local_3a8[0].id_ = 0;
    local_3f0.ptr_ = "foo";
    local_3f0.length_ = 3;
    local_3f0.is_immutable_ = true;
    local_3f0.id_ = 0;
    local_3d0.dict_ = local_208;
    bVar14 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_3d0,local_3a8,&local_3f0);
    if (!bVar14) break;
    local_3a8[0].ptr_ = "FOO2";
    local_3a8[0].length_ = 4;
    local_3a8[0].is_immutable_ = true;
    local_3a8[0].id_ = 0;
    local_3f0.ptr_ = "foo2";
    local_3f0.length_ = 4;
    local_3f0.is_immutable_ = true;
    local_3f0.id_ = 0;
    bVar14 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_3d0,local_3a8,&local_3f0);
    if (!bVar14) {
      _GLOBAL__N_1::Test_TemplateDictionary_SetValueAndTemplateStringAndArena::Run();
      break;
    }
    local_3f0.length_ = 0;
    local_3f0._16_8_ = local_3f0._16_8_ & 0xffffffffffffff00;
    local_3f0.ptr_ = &local_3f0.is_immutable_;
    ctemplate::TemplateDictionary::DumpToString((string *)local_208,(int)&local_3f0);
    snprintf((char *)local_3a8,0x100,
             "global dictionary {\n   BI_NEWLINE: >\n<\n   BI_SPACE: > <\n   GLOBAL: >top<\n};\ndictionary \'test_arena%d\' {\n   FOO: >foo<\n   FOO2: >foo2<\n   FOO3: >foo3<\n   FOO4: >foo4<\n   FOO5: >Olaf<\n   FOO6: >6<\n   FOO7: >7<\n}\n"
             ,local_3b0);
    pcVar13 = local_3f0.ptr_;
    iVar15 = strcmp(local_3f0.ptr_,(char *)local_3a8);
    if (iVar15 != 0) goto LAB_0010abca;
    if ((bool *)pcVar13 != &local_3f0.is_immutable_) {
      operator_delete(pcVar13);
    }
    ctemplate::TemplateDictionary::~TemplateDictionary(local_208);
    local_3b0 = local_3b0 + 1;
    if (local_3b0 == 3) {
      ctemplate::BaseArena::~BaseArena((BaseArena *)local_198);
      return;
    }
  }
  _GLOBAL__N_1::Test_TemplateDictionary_SetValueAndTemplateStringAndArena::Run();
LAB_0010abca:
  _GLOBAL__N_1::Test_TemplateDictionary_SetValueAndTemplateStringAndArena::Run();
  if ((bool *)local_3f0.ptr_ != &local_3f0.is_immutable_) {
    operator_delete(local_3f0.ptr_);
  }
  ctemplate::TemplateDictionary::~TemplateDictionary(local_208);
  ctemplate::BaseArena::~BaseArena((BaseArena *)local_198);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST(TemplateDictionary, SetValueAndTemplateStringAndArena) {
  // Try both with the arena, and without.
  UnsafeArena arena(100);
  // We run the test with arena twice to double-check we don't ever delete it
  UnsafeArena* arenas[] = {&arena, &arena, NULL};
  for (int i = 0; i < sizeof(arenas)/sizeof(*arenas); ++i) {
    TemplateDictionary dict(string("test_arena") + char('0'+i), arenas[i]);

    // Test copying char*s, strings, and explicit TemplateStrings
    dict.SetValue("FOO", "foo");
    dict.SetValue(string("FOO2"), TemplateString("foo2andmore", 4));
		dict["FOO3"] = "foo3";
		dict[string("FOO4")] = TemplateString("foo4andmore", 4);
		dict["FOO5"] = string("Olaf");
		dict["FOO6"] = 6;
		dict["FOO7"] = long(7);

    TemplateDictionaryPeer peer(&dict);
    // verify what happened
    EXPECT_TRUE(peer.ValueIs("FOO", "foo"));
    EXPECT_TRUE(peer.ValueIs("FOO2", "foo2"));
    string dump;
    dict.DumpToString(&dump);
    char expected[256];
    snprintf(expected, sizeof(expected),
             ("global dictionary {\n"
              "   BI_NEWLINE: >\n"
              "<\n"
              "   BI_SPACE: > <\n"
              "   GLOBAL: >top<\n"
              "};\n"
              "dictionary 'test_arena%d' {\n"
              "   FOO: >foo<\n"
              "   FOO2: >foo2<\n"
              "   FOO3: >foo3<\n"
              "   FOO4: >foo4<\n"
              "   FOO5: >Olaf<\n"
              "   FOO6: >6<\n"
              "   FOO7: >7<\n"
              "}\n"), i);
    EXPECT_STREQ(dump.c_str(), expected);
  }
}